

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

void __thiscall deci::ast_binary_t::~ast_binary_t(ast_binary_t *this)

{
  if (this->a != (ast_item_t *)0x0) {
    (*this->a->_vptr_ast_item_t[4])();
  }
  if (this->b != (ast_item_t *)0x0) {
    (*this->b->_vptr_ast_item_t[4])();
  }
  std::__cxx11::string::~string((string *)&this->identifier);
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d3d8;
  return;
}

Assistant:

ast_binary_t::~ast_binary_t() {
    delete this->a;
    delete this->b;
  }